

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdBool32x4OperationX86X64.cpp
# Opt level: O0

bool Js::SIMDBool32x4Operation::OpAllTrue<int>(SIMDValue *simd)

{
  undefined8 in_RDX;
  _x86_SIMDValue _Var1;
  SIMDValue val;
  int mask_8;
  X86SIMDValue x86Simd;
  undefined1 local_30 [8];
  SIMDValue canonSimd;
  SIMDValue *simd_local;
  
  val.field_0.f64[1] = (Type)in_RDX;
  val.field_0.f64[0] = (Type)(simd->field_0).i64[1];
  canonSimd.field_0.f64[1] = (Type)simd;
  _local_30 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
              SIMDUtils::CanonicalizeToBools<int>((SIMDUtils *)(simd->field_0).f64[0],val);
  _Var1 = _x86_SIMDValue::ToX86SIMDValue((SIMDValue *)local_30);
  return (ushort)((ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 7,0) & 1) |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161((undefined1  [16])_Var1.field_0 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(_Var1.field_0._15_1_ >> 7) << 0xf) == 0xffff;
}

Assistant:

bool SIMDBool32x4Operation::OpAllTrue(const SIMDValue& simd)
    {
        SIMDValue canonSimd = SIMDUtils::CanonicalizeToBools<T>(simd); //copy-by-value since we need to modify the copy
        X86SIMDValue x86Simd = X86SIMDValue::ToX86SIMDValue(canonSimd);
        int mask_8 = _mm_movemask_epi8(x86Simd.m128i_value); //latency 3, throughput 1
        return mask_8 == 0xFFFF;
    }